

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::fatal<char_const(&)[59],std::__cxx11::string,std::__cxx11::string>
          (Reporter *this,ReturnCode return_code,char (*args) [59],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  format_string<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_> fmt;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  FatalError *in_RDI;
  size_t in_R8;
  ReturnCode in_stack_fffffffffffffeec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  ostream *in_stack_ffffffffffffff20;
  basic_string_view<char> in_stack_ffffffffffffff28;
  char *os;
  
  os = "{} fatal: ";
  pcVar1 = (char *)std::char_traits<char>::length((char_type *)0x2af649);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff20,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff18);
  args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::char_traits<char>::length((char_type *)0x2af6e7);
  fmt.str_.size_ = in_R8;
  fmt.str_.data_ = pcVar1;
  ::fmt::v10::print<std::__cxx11::string,std::__cxx11::string>((ostream *)os,fmt,args_00,in_RDX);
  std::char_traits<char>::length((char_type *)0x2af785);
  ::fmt::v10::print<>(in_stack_ffffffffffffff20,(format_string<>)in_stack_ffffffffffffff28);
  uVar2 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(in_RDI,in_stack_fffffffffffffeec);
  __cxa_throw(uVar2,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal(ReturnCode return_code, Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
        throw FatalError(return_code);
    }